

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,long *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  unsigned_long *puVar1;
  char *pcVar2;
  bool bVar3;
  idx_t iVar4;
  utf8proc_ssize_t uVar5;
  ulong uVar6;
  utf8proc_ssize_t len_2;
  undefined8 uVar7;
  idx_t iVar8;
  utf8proc_ssize_t len;
  idx_t iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  anon_union_16_2_67f50693_for_value local_a8;
  ulong local_98;
  string_t *local_90;
  string_t *local_88;
  long *local_80;
  anon_union_16_2_67f50693_for_value local_78;
  utf8proc_int32_t local_64;
  ulong local_60;
  ulong local_58;
  ValidityMask *local_50;
  ulong local_48;
  ulong local_40;
  char *local_38;
  
  local_90 = rdata;
  local_88 = ldata;
  local_80 = result_data;
  local_58 = count;
  local_50 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      local_98 = *(ulong *)&rdata->value;
      pcVar2 = (rdata->value).pointer.ptr;
      iVar4 = 0;
      do {
        local_a8._0_8_ = *(undefined8 *)&local_88[iVar4].value;
        local_a8.pointer.ptr = local_88[iVar4].value.pointer.ptr;
        local_78._0_8_ = local_98;
        local_78.pointer.ptr = pcVar2;
        iVar9 = FindStrInStr((string_t *)&local_a8.pointer,(string_t *)&local_78.pointer);
        if (iVar9 == 0xffffffffffffffff) {
          lVar10 = 0;
        }
        else if ((long)iVar9 < 1) {
          lVar10 = 1;
        }
        else {
          uVar7 = local_a8.pointer.prefix;
          if (0xc < local_a8.pointer.length) {
            uVar7 = local_a8.pointer.ptr;
          }
          lVar10 = 1;
          do {
            uVar5 = utf8proc_iterate((utf8proc_uint8_t *)uVar7,iVar9,&local_64);
            uVar7 = uVar7 + uVar5;
            lVar10 = lVar10 + 1;
            iVar8 = iVar9 - uVar5;
            bVar3 = uVar5 <= (long)iVar9;
            iVar9 = iVar8;
          } while (iVar8 != 0 && bVar3);
        }
        local_80[iVar4] = lVar10;
        iVar4 = iVar4 + 1;
      } while (iVar4 != local_58);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_60 = count + 0x3f >> 6;
    uVar11 = 0;
    local_48 = 0;
    do {
      puVar1 = (local_50->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar6 = 0xffffffffffffffff;
      }
      else {
        uVar6 = puVar1[local_48];
      }
      uVar13 = uVar11 + 0x40;
      if (local_58 <= uVar11 + 0x40) {
        uVar13 = local_58;
      }
      uVar12 = uVar13;
      if (uVar6 != 0) {
        uVar12 = uVar11;
        if (uVar6 == 0xffffffffffffffff) {
          if (uVar11 < uVar13) {
            local_98 = *(ulong *)&local_90->value;
            local_38 = (local_90->value).pointer.ptr;
            do {
              local_a8._0_8_ = *(undefined8 *)&local_88[uVar11].value;
              local_a8.pointer.ptr = local_88[uVar11].value.pointer.ptr;
              local_78._0_8_ = local_98;
              local_78.pointer.ptr = local_38;
              iVar4 = FindStrInStr((string_t *)&local_a8.pointer,(string_t *)&local_78.pointer);
              if (iVar4 == 0xffffffffffffffff) {
                lVar10 = 0;
              }
              else if ((long)iVar4 < 1) {
                lVar10 = 1;
              }
              else {
                uVar7 = local_a8.pointer.prefix;
                if (0xc < local_a8.pointer.length) {
                  uVar7 = local_a8.pointer.ptr;
                }
                lVar10 = 1;
                do {
                  uVar5 = utf8proc_iterate((utf8proc_uint8_t *)uVar7,iVar4,&local_64);
                  uVar7 = uVar7 + uVar5;
                  lVar10 = lVar10 + 1;
                  iVar9 = iVar4 - uVar5;
                  bVar3 = uVar5 <= (long)iVar4;
                  iVar4 = iVar9;
                } while (iVar9 != 0 && bVar3);
              }
              local_80[uVar11] = lVar10;
              uVar11 = uVar11 + 1;
              uVar12 = uVar11;
            } while (uVar11 != uVar13);
          }
        }
        else {
          local_98 = uVar6;
          local_40 = uVar11;
          if (uVar11 < uVar13) {
            do {
              if ((uVar6 >> ((ulong)(uint)((int)uVar12 - (int)uVar11) & 0x3f) & 1) != 0) {
                local_a8._0_8_ = *(undefined8 *)&local_88[uVar12].value;
                local_a8.pointer.ptr = local_88[uVar12].value.pointer.ptr;
                local_78._0_8_ = *(undefined8 *)&local_90->value;
                local_78.pointer.ptr = (local_90->value).pointer.ptr;
                iVar4 = FindStrInStr((string_t *)&local_a8.pointer,(string_t *)&local_78.pointer);
                if (iVar4 == 0xffffffffffffffff) {
                  lVar10 = 0;
                }
                else if ((long)iVar4 < 1) {
                  lVar10 = 1;
                }
                else {
                  uVar7 = local_a8.pointer.prefix;
                  if (0xc < local_a8.pointer.length) {
                    uVar7 = local_a8.pointer.ptr;
                  }
                  lVar10 = 1;
                  do {
                    uVar5 = utf8proc_iterate((utf8proc_uint8_t *)uVar7,iVar4,&local_64);
                    uVar7 = uVar7 + uVar5;
                    lVar10 = lVar10 + 1;
                    iVar9 = iVar4 - uVar5;
                    bVar3 = uVar5 <= (long)iVar4;
                    iVar4 = iVar9;
                  } while (iVar9 != 0 && bVar3);
                }
                local_80[uVar12] = lVar10;
                uVar6 = local_98;
                uVar11 = local_40;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 != uVar13);
          }
        }
      }
      uVar11 = uVar12;
      local_48 = local_48 + 1;
    } while (local_48 != local_60);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}